

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

void file_callback(log_Event *ev)

{
  size_t sVar1;
  char buf [64];
  
  sVar1 = strftime(buf,0x40,"%Y-%m-%d %H:%M:%S",(tm *)ev->time);
  buf[sVar1] = '\0';
  fprintf((FILE *)ev->udata,"%s %-7s %s:%d: ",buf,level_strings[(ev->level + 0x20) / 0x20],ev->file,
          (ulong)(uint)ev->line);
  vfprintf((FILE *)ev->udata,ev->fmt,ev);
  fputc(10,(FILE *)ev->udata);
  fflush((FILE *)ev->udata);
  return;
}

Assistant:

static void file_callback(log_Event *ev) {
    char buf[64];
    buf[strftime(buf, sizeof(buf), "%Y-%m-%d %H:%M:%S", ev->time)] = '\0';
    fprintf(ev->udata, "%s %-7s %s:%d: ", buf, get_level_string(ev->level),
            ev->file, ev->line);
    vfprintf(ev->udata, ev->fmt, ev->ap);
    fprintf(ev->udata, "\n");
    fflush(ev->udata);
}